

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

bool Rml::Initialise(void)

{
  long *plVar1;
  code *pcVar2;
  RenderInterface *render_interface;
  _Head_base<0UL,_Rml::RenderManager_*,_false> __p;
  bool bVar3;
  RenderManager *in_RAX;
  SystemInterface *this;
  FileInterface *this_00;
  FontEngineInterface *this_01;
  undefined8 *puVar4;
  long lVar5;
  RenderManager *this_02;
  __uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *this_03;
  _Head_base<0UL,_Rml::RenderManager_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((initialised == '\x01') &&
     (bVar3 = Assert("Rml::Initialise() called, but RmlUi is already initialised!",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Core.cpp"
                     ,0x6f), !bVar3)) goto LAB_001ee37c;
  Detail::InitializeElementInstancerPools();
  ElementMetaPool::Initialize();
  LayoutPools::Initialize();
  InitializeComputeProperty();
  ControlledLifetimeResource<Rml::CoreData>::Initialize
            ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  if (system_interface == 0) {
    this = (SystemInterface *)operator_new(8);
    SystemInterface::SystemInterface(this);
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    plVar1 = *(long **)core_data._8_8_;
    *(SystemInterface **)core_data._8_8_ = this;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    system_interface = *(long *)core_data._8_8_;
  }
  if (file_interface == 0) {
    this_00 = (FileInterface *)operator_new(8);
    this_00->_vptr_FileInterface = (_func_int **)0x0;
    FileInterface::FileInterface(this_00);
    this_00->_vptr_FileInterface = (_func_int **)&PTR__FileInterfaceDefault_00330738;
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    plVar1 = *(long **)(core_data._8_8_ + 8);
    *(FileInterface **)(core_data._8_8_ + 8) = this_00;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    file_interface = *(long *)(core_data._8_8_ + 8);
  }
  if (font_interface == (long *)0x0) {
    this_01 = (FontEngineInterface *)operator_new(8);
    this_01->_vptr_FontEngineInterface = (_func_int **)0x0;
    FontEngineInterface::FontEngineInterface(this_01);
    this_01->_vptr_FontEngineInterface = (_func_int **)&PTR__FontEngineInterface_003334b8;
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    lVar5 = core_data._8_8_;
    plVar1 = *(long **)(core_data._8_8_ + 0x10);
    *(FontEngineInterface **)(core_data._8_8_ + 0x10) = this_01;
    if ((plVar1 != (long *)0x0) &&
       (((**(code **)(*plVar1 + 8))(), lVar5 = core_data._8_8_, core_data._8_8_ == 0 &&
        (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                        ,0x46), lVar5 = core_data._8_8_, !bVar3)))) goto LAB_001ee37c;
    font_interface = *(long **)(lVar5 + 0x10);
  }
  if (text_input_handler == 0) {
    puVar4 = (undefined8 *)operator_new(8);
    *puVar4 = &PTR__NonCopyMoveable_0032e1d8;
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) goto LAB_001ee37c;
    lVar5 = core_data._8_8_;
    plVar1 = *(long **)(core_data._8_8_ + 0x18);
    *(undefined8 **)(core_data._8_8_ + 0x18) = puVar4;
    if ((plVar1 != (long *)0x0) &&
       (((**(code **)(*plVar1 + 8))(), lVar5 = core_data._8_8_, core_data._8_8_ == 0 &&
        (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                        "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                        ,0x46), lVar5 = core_data._8_8_, !bVar3)))) goto LAB_001ee37c;
    text_input_handler = *(long *)(lVar5 + 0x18);
  }
  EventSpecificationInterface::Initialize();
  Detail::InitializeObserverPtrPool();
  render_interface = Rml::render_interface;
  if (Rml::render_interface != (RenderInterface *)0x0) {
    this_02 = (RenderManager *)operator_new(0xe0);
    RenderManager::RenderManager(this_02,render_interface);
    local_18._M_head_impl = this_02;
    if ((core_data._8_8_ == 0) &&
       (bVar3 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), !bVar3)) {
LAB_001ee37c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    this_03 = (__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
              itlib::
              flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
              ::operator[]<Rml::RenderInterface*&>
                        ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                          *)(core_data._8_8_ + 0x20),&Rml::render_interface);
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (RenderManager *)0x0;
    ::std::__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::reset
              (this_03,__p._M_head_impl);
    ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::~unique_ptr
              ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)&local_18
              );
  }
  (**(code **)(*font_interface + 0x10))();
  StyleSheetSpecification::Initialise();
  StyleSheetParser::Initialise();
  StyleSheetFactory::Initialise();
  TemplateCache::Initialise();
  Factory::Initialise();
  PluginRegistry::NotifyInitialise();
  initialised = 1;
  return true;
}

Assistant:

bool Initialise()
{
	RMLUI_ASSERTMSG(!initialised, "Rml::Initialise() called, but RmlUi is already initialised!");

	InitializeMemoryPools();
	InitializeComputeProperty();

	core_data.Initialize();

	// Install default interfaces as appropriate.
	if (!system_interface)
	{
		core_data->default_system_interface = MakeUnique<SystemInterface>();
		system_interface = core_data->default_system_interface.get();
	}

	if (!file_interface)
	{
#ifndef RMLUI_NO_FILE_INTERFACE_DEFAULT
		core_data->default_file_interface = MakeUnique<FileInterfaceDefault>();
		file_interface = core_data->default_file_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No file interface set!");
		return false;
#endif
	}

	if (!font_interface)
	{
#ifdef RMLUI_FONT_ENGINE_FREETYPE
		core_data->default_font_interface = MakeUnique<FontEngineInterfaceDefault>();
		font_interface = core_data->default_font_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No font engine interface set!");
		return false;
#endif
	}

	if (!text_input_handler)
	{
		core_data->default_text_input_handler = MakeUnique<TextInputHandler>();
		text_input_handler = core_data->default_text_input_handler.get();
	}

	EventSpecificationInterface::Initialize();

	Detail::InitializeObserverPtrPool();

	if (render_interface)
		core_data->render_managers[render_interface] = MakeUnique<RenderManager>(render_interface);

	font_interface->Initialize();

	StyleSheetSpecification::Initialise();
	StyleSheetParser::Initialise();
	StyleSheetFactory::Initialise();

	TemplateCache::Initialise();

	Factory::Initialise();

	// Initialise plugins integrated with Core.
#ifdef RMLUI_LOTTIE_PLUGIN
	Lottie::Initialise();
#endif
#ifdef RMLUI_SVG_PLUGIN
	SVG::Initialise();
#endif

	// Notify all plugins we're starting up.
	PluginRegistry::NotifyInitialise();

	initialised = true;

	return true;
}